

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

void roaring_bitmap_statistics(roaring_bitmap_t *r,roaring_statistics_t *stat)

{
  uint32_t uVar1;
  uint uVar2;
  void **ppvVar3;
  uint8_t *puVar4;
  uint8_t uVar5;
  int iVar6;
  run_container_t *prVar7;
  run_container_t *run;
  uint8_t uVar8;
  long lVar9;
  
  stat->sum_value = 0;
  stat->cardinality = 0;
  stat->n_bytes_run_containers = 0;
  stat->n_bytes_bitset_containers = 0;
  stat->max_value = 0;
  stat->min_value = 0;
  stat->n_values_array_containers = 0;
  stat->n_values_run_containers = 0;
  stat->n_values_bitset_containers = 0;
  stat->n_bytes_array_containers = 0;
  stat->n_containers = 0;
  stat->n_array_containers = 0;
  stat->n_run_containers = 0;
  stat->n_bitset_containers = 0;
  stat->n_containers = (r->high_low_container).size;
  uVar1 = roaring_bitmap_minimum(r);
  stat->min_value = uVar1;
  uVar1 = roaring_bitmap_maximum(r);
  stat->max_value = uVar1;
  if (0 < (r->high_low_container).size) {
    ppvVar3 = (r->high_low_container).containers;
    puVar4 = (r->high_low_container).typecodes;
    lVar9 = 0;
    do {
      prVar7 = (run_container_t *)ppvVar3[lVar9];
      uVar8 = puVar4[lVar9];
      run = prVar7;
      uVar5 = uVar8;
      if (uVar8 == '\x04') {
        uVar5 = *(uint8_t *)&prVar7->runs;
        run = *(run_container_t **)prVar7;
      }
      if (uVar5 == '\x03') {
        uVar2 = run_container_cardinality(run);
        ppvVar3 = (r->high_low_container).containers;
        puVar4 = (r->high_low_container).typecodes;
        prVar7 = (run_container_t *)ppvVar3[lVar9];
        uVar8 = puVar4[lVar9];
      }
      else {
        uVar2 = run->n_runs;
      }
      if (uVar8 == '\x04') {
        uVar8 = *(uint8_t *)&prVar7->runs;
        prVar7 = *(run_container_t **)prVar7;
      }
      if (uVar8 == '\x01') {
        iVar6 = 0x2000;
      }
      else if (uVar8 == '\x03') {
        iVar6 = prVar7->n_runs * 4 + 2;
      }
      else {
        iVar6 = prVar7->n_runs * 2;
      }
      stat->cardinality = stat->cardinality + (ulong)uVar2;
      if (uVar5 == '\x03') {
        stat->n_run_containers = stat->n_run_containers + 1;
        stat->n_values_run_containers = stat->n_values_run_containers + uVar2;
        stat->n_bytes_run_containers = stat->n_bytes_run_containers + iVar6;
      }
      else if (uVar5 == '\x02') {
        stat->n_array_containers = stat->n_array_containers + 1;
        stat->n_values_array_containers = stat->n_values_array_containers + uVar2;
        stat->n_bytes_array_containers = stat->n_bytes_array_containers + iVar6;
      }
      else {
        stat->n_bitset_containers = stat->n_bitset_containers + 1;
        stat->n_values_bitset_containers = stat->n_values_bitset_containers + uVar2;
        stat->n_bytes_bitset_containers = stat->n_bytes_bitset_containers + iVar6;
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < (r->high_low_container).size);
  }
  return;
}

Assistant:

void roaring_bitmap_statistics(const roaring_bitmap_t *r,
                               roaring_statistics_t *stat) {
    const roaring_array_t *ra = &r->high_low_container;

    memset(stat, 0, sizeof(*stat));
    stat->n_containers = ra->size;
    stat->min_value = roaring_bitmap_minimum(r);
    stat->max_value = roaring_bitmap_maximum(r);

    for (int i = 0; i < ra->size; ++i) {
        uint8_t truetype =
            get_container_type(ra->containers[i], ra->typecodes[i]);
        uint32_t card =
            container_get_cardinality(ra->containers[i], ra->typecodes[i]);
        uint32_t sbytes =
            container_size_in_bytes(ra->containers[i], ra->typecodes[i]);
        stat->cardinality += card;
        switch (truetype) {
            case BITSET_CONTAINER_TYPE:
                stat->n_bitset_containers++;
                stat->n_values_bitset_containers += card;
                stat->n_bytes_bitset_containers += sbytes;
                break;
            case ARRAY_CONTAINER_TYPE:
                stat->n_array_containers++;
                stat->n_values_array_containers += card;
                stat->n_bytes_array_containers += sbytes;
                break;
            case RUN_CONTAINER_TYPE:
                stat->n_run_containers++;
                stat->n_values_run_containers += card;
                stat->n_bytes_run_containers += sbytes;
                break;
            default:
                assert(false);
                roaring_unreachable;
        }
    }
}